

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

uint fl_utf8from_mb(char *dst,uint dstlen,char *src,uint srclen)

{
  wchar_t wVar1;
  size_t sVar2;
  wchar_t *__pwcs;
  uint uVar3;
  wchar_t lbuf [1024];
  wchar_t local_1038 [1026];
  
  wVar1 = fl_utf8locale();
  if (wVar1 == L'\0') {
    __pwcs = local_1038;
    sVar2 = mbstowcs(__pwcs,src,0x400);
    uVar3 = (uint)sVar2;
    if (0x3ff < (int)uVar3) {
      sVar2 = mbstowcs((wchar_t *)0x0,src,0);
      uVar3 = (int)sVar2 + 1;
      __pwcs = (wchar_t *)malloc((long)(int)uVar3 * 4);
      mbstowcs(__pwcs,src,(long)(int)uVar3);
    }
    if (-1 < (int)uVar3) {
      uVar3 = fl_utf8fromwc(dst,dstlen,__pwcs,uVar3);
      if (__pwcs == local_1038) {
        return uVar3;
      }
      free(__pwcs);
      return uVar3;
    }
  }
  if (srclen < dstlen) {
    memcpy(dst,src,(ulong)srclen);
    dst[srclen] = '\0';
  }
  return srclen;
}

Assistant:

unsigned fl_utf8from_mb(char* dst, unsigned dstlen,
		    const char* src, unsigned srclen)
{
  if (!fl_utf8locale()) {
#ifdef WIN32
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    unsigned length;
    unsigned ret;
    length = MultiByteToWideChar(GetACP(), 0, src, srclen, buf, 1024);
    if ((length == 0)&&(GetLastError()==ERROR_INSUFFICIENT_BUFFER)) {
      length = MultiByteToWideChar(GetACP(), 0, src, srclen, 0, 0);
      buf = (wchar_t*)(malloc(length*sizeof(wchar_t)));
      MultiByteToWideChar(GetACP(), 0, src, srclen, buf, length);
    }
    ret = fl_utf8fromwc(dst, dstlen, buf, length);
    if (buf != lbuf) free((void*)buf);
    return ret;
#else
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    int length;
    unsigned ret;
    length = mbstowcs(buf, src, 1024);
    if (length >= 1024) {
      length = mbstowcs(0, src, 0)+1;
      buf = (wchar_t*)(malloc(length*sizeof(wchar_t)));
      mbstowcs(buf, src, length);
    }
    if (length >= 0) {
      ret = fl_utf8fromwc(dst, dstlen, buf, length);
      if (buf != lbuf) free((void*)buf);
      return ret;
    }
    /* errors in conversion return the UTF-8 unchanged */
#endif
  }
  /* identity transform: */
  if (srclen < dstlen) {
    memcpy(dst, src, srclen);
    dst[srclen] = 0;
  } else {
    /* Buffer insufficent or buffer query */
  }
  return srclen;
}